

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlElementContentPtr xmlNewDocElementContent(xmlDocPtr doc,xmlChar *name,xmlElementContentType type)

{
  xmlChar *name_00;
  _xmlDictEntry *p_Var1;
  _xmlDict *p_Var2;
  xmlChar *tmp;
  _xmlDict *p_Stack_38;
  int l;
  xmlDictPtr dict;
  xmlElementContentPtr ret;
  xmlChar *pxStack_20;
  xmlElementContentType type_local;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  p_Stack_38 = (_xmlDict *)0x0;
  if (doc != (xmlDocPtr)0x0) {
    p_Stack_38 = doc->dict;
  }
  ret._4_4_ = type;
  pxStack_20 = name;
  name_local = (xmlChar *)doc;
  if (type != XML_ELEMENT_CONTENT_PCDATA) {
    if (type == XML_ELEMENT_CONTENT_ELEMENT) {
      if (name == (xmlChar *)0x0) {
        xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,
                    "xmlNewElementContent : name == NULL !\n",(char *)0x0);
      }
      goto LAB_001d93ac;
    }
    if (1 < type - XML_ELEMENT_CONTENT_SEQ) {
      xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,
                  "Internal: ELEMENT content corrupted invalid type\n",(char *)0x0);
      return (xmlElementContentPtr)0x0;
    }
  }
  if (name != (xmlChar *)0x0) {
    xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,
                "xmlNewElementContent : name != NULL !\n",(char *)0x0);
  }
LAB_001d93ac:
  dict = (xmlDictPtr)(*xmlMalloc)(0x30);
  if (dict == (xmlDictPtr)0x0) {
    xmlVErrMemory((xmlValidCtxtPtr)0x0,"malloc failed");
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    memset(dict,0,0x30);
    dict->ref_counter = ret._4_4_;
    *(undefined4 *)&dict->field_0x4 = 1;
    if (pxStack_20 != (xmlChar *)0x0) {
      name_00 = xmlSplitQName3(pxStack_20,(int *)((long)&tmp + 4));
      if (name_00 == (xmlChar *)0x0) {
        if (p_Stack_38 == (xmlDictPtr)0x0) {
          p_Var1 = (_xmlDictEntry *)xmlStrdup(pxStack_20);
          dict->dict = p_Var1;
        }
        else {
          p_Var1 = (_xmlDictEntry *)xmlDictLookup(p_Stack_38,pxStack_20,-1);
          dict->dict = p_Var1;
        }
      }
      else if (p_Stack_38 == (xmlDictPtr)0x0) {
        p_Var2 = (_xmlDict *)xmlStrndup(pxStack_20,tmp._4_4_);
        dict->subdict = p_Var2;
        p_Var1 = (_xmlDictEntry *)xmlStrdup(name_00);
        dict->dict = p_Var1;
      }
      else {
        p_Var2 = (_xmlDict *)xmlDictLookup(p_Stack_38,pxStack_20,tmp._4_4_);
        dict->subdict = p_Var2;
        p_Var1 = (_xmlDictEntry *)xmlDictLookup(p_Stack_38,name_00,-1);
        dict->dict = p_Var1;
      }
    }
    doc_local = (xmlDocPtr)dict;
  }
  return (xmlElementContentPtr)doc_local;
}

Assistant:

xmlElementContentPtr
xmlNewDocElementContent(xmlDocPtr doc, const xmlChar *name,
                        xmlElementContentType type) {
    xmlElementContentPtr ret;
    xmlDictPtr dict = NULL;

    if (doc != NULL)
        dict = doc->dict;

    switch(type) {
	case XML_ELEMENT_CONTENT_ELEMENT:
	    if (name == NULL) {
	        xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
			"xmlNewElementContent : name == NULL !\n",
			NULL);
	    }
	    break;
        case XML_ELEMENT_CONTENT_PCDATA:
	case XML_ELEMENT_CONTENT_SEQ:
	case XML_ELEMENT_CONTENT_OR:
	    if (name != NULL) {
	        xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
			"xmlNewElementContent : name != NULL !\n",
			NULL);
	    }
	    break;
	default:
	    xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "Internal: ELEMENT content corrupted invalid type\n",
		    NULL);
	    return(NULL);
    }
    ret = (xmlElementContentPtr) xmlMalloc(sizeof(xmlElementContent));
    if (ret == NULL) {
	xmlVErrMemory(NULL, "malloc failed");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlElementContent));
    ret->type = type;
    ret->ocur = XML_ELEMENT_CONTENT_ONCE;
    if (name != NULL) {
        int l;
	const xmlChar *tmp;

	tmp = xmlSplitQName3(name, &l);
	if (tmp == NULL) {
	    if (dict == NULL)
		ret->name = xmlStrdup(name);
	    else
	        ret->name = xmlDictLookup(dict, name, -1);
	} else {
	    if (dict == NULL) {
		ret->prefix = xmlStrndup(name, l);
		ret->name = xmlStrdup(tmp);
	    } else {
	        ret->prefix = xmlDictLookup(dict, name, l);
		ret->name = xmlDictLookup(dict, tmp, -1);
	    }
	}
    }
    return(ret);
}